

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::setRootIndex(QTableView *this,QModelIndex *index)

{
  long lVar1;
  char cVar2;
  QWidget *this_00;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  cVar2 = comparesEqual((QPersistentModelIndex *)(lVar1 + 0x3b8),index);
  if (cVar2 != '\0') {
    this_00 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QWidget::update(this_00);
    return;
  }
  (**(code **)(**(long **)(lVar1 + 0x588) + 0x218))(*(long **)(lVar1 + 0x588),index);
  (**(code **)(**(long **)(lVar1 + 0x580) + 0x218))(*(long **)(lVar1 + 0x580),index);
  QAbstractItemView::setRootIndex((QAbstractItemView *)this,index);
  return;
}

Assistant:

void QTableView::setRootIndex(const QModelIndex &index)
{
    Q_D(QTableView);
    if (index == d->root) {
        viewport()->update();
        return;
    }
    d->verticalHeader->setRootIndex(index);
    d->horizontalHeader->setRootIndex(index);
    QAbstractItemView::setRootIndex(index);
}